

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void stbi__tga_read_rgb16(stbi__context *s,stbi_uc *out)

{
  byte bVar1;
  byte bVar2;
  
  bVar1 = stbi__get8(s);
  bVar2 = stbi__get8(s);
  *out = (stbi_uc)(((uint)(bVar2 >> 2 & 0x1f) * 0xff) / 0x1f);
  out[1] = (stbi_uc)((ushort)((CONCAT11(bVar2,bVar1) >> 5 & 0x1f) * 0xff) / 0x1f);
  out[2] = (stbi_uc)(((uint)(bVar1 & 0x1f) * 0xff) / 0x1f);
  return;
}

Assistant:

static void stbi__tga_read_rgb16(stbi__context *s, stbi_uc* out)
{
   stbi__uint16 px = (stbi__uint16)stbi__get16le(s);
   stbi__uint16 fiveBitMask = 31;
   // we have 3 channels with 5bits each
   int r = (px >> 10) & fiveBitMask;
   int g = (px >> 5) & fiveBitMask;
   int b = px & fiveBitMask;
   // Note that this saves the data in RGB(A) order, so it doesn't need to be swapped later
   out[0] = (stbi_uc)((r * 255)/31);
   out[1] = (stbi_uc)((g * 255)/31);
   out[2] = (stbi_uc)((b * 255)/31);

   // some people claim that the most significant bit might be used for alpha
   // (possibly if an alpha-bit is set in the "image descriptor byte")
   // but that only made 16bit test images completely translucent..
   // so let's treat all 15 and 16bit TGAs as RGB with no alpha.
}